

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::closePersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QAbstractItemViewPrivate *index_00;
  QAbstractItemViewPrivate *this_00;
  QAbstractItemViewPrivate *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QWidget *editor;
  QModelIndex *in_stack_ffffffffffffffa8;
  QModelIndex *in_stack_ffffffffffffffe0;
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = d_func((QAbstractItemView *)0x80cedf);
  QAbstractItemViewPrivate::editorForIndex(in_RSI,(QModelIndex *)index_00);
  this_00 = (QAbstractItemViewPrivate *)QPointer<QWidget>::data((QPointer<QWidget> *)0x80cefb);
  if (this_00 != (QAbstractItemViewPrivate *)0x0) {
    selectionModel((QAbstractItemView *)in_RSI);
    QItemSelectionModel::currentIndex();
    bVar2 = ::operator==((QModelIndex *)in_RSI,in_stack_ffffffffffffffa8);
    if (bVar2) {
      (**(code **)(*in_RDI + 0x290))(in_RDI,this_00,4);
    }
    QSet<QWidget_*>::remove(&index_00->persistent,&stack0xfffffffffffffff0);
    QAbstractItemViewPrivate::removeEditor(this_00,(QWidget *)this);
    QAbstractItemViewPrivate::releaseEditor
              (this_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::closePersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (QWidget *editor = d->editorForIndex(index).widget.data()) {
        if (index == selectionModel()->currentIndex())
            closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
        d->persistent.remove(editor);
        d->removeEditor(editor);
        d->releaseEditor(editor, index);
    }
}